

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication_p.h
# Opt level: O1

bool QSystemTrayIconPrivate::supportsMessages_sys(void)

{
  undefined1 uVar1;
  long *plVar2;
  QPlatformSystemTrayIcon *oldD;
  
  plVar2 = (long *)(**(code **)(*QGuiApplicationPrivate::platform_theme + 0x40))();
  if (plVar2 == (long *)0x0) {
    uVar1 = 1;
  }
  else {
    uVar1 = (**(code **)(*plVar2 + 0xa0))(plVar2);
    (**(code **)(*plVar2 + 0x20))(plVar2);
  }
  return (bool)uVar1;
}

Assistant:

static QPlatformTheme *platformTheme()
    { return platform_theme; }